

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearSystem.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::LinearSystem::dynamicsControlFirstDerivative
          (LinearSystem *this,VectorDynSize *param_2,double time,MatrixDynSize *dynamicsDerivative)

{
  int iVar1;
  element_type *peVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  char *pcVar4;
  size_t sVar5;
  size_t sVar6;
  MatrixDynSize *in_RDX;
  DynamicalSystem *in_RDI;
  double in_XMM0_Qa;
  ostringstream errorMsg_1;
  ostringstream errorMsg;
  MatrixDynSize *controlMatrix;
  bool isValid;
  string local_378 [32];
  ostringstream local_358 [376];
  string local_1e0 [48];
  ostringstream local_1b0 [376];
  MatrixDynSize *local_38;
  byte local_29;
  MatrixDynSize *local_28;
  double local_20;
  byte local_1;
  
  local_29 = 0;
  local_28 = in_RDX;
  local_20 = in_XMM0_Qa;
  peVar2 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2ea89a);
  iVar1 = (*peVar2->_vptr_TimeVaryingObject[2])(local_20,peVar2,&local_29);
  local_38 = (MatrixDynSize *)CONCAT44(extraout_var,iVar1);
  if ((local_29 & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_1b0);
    poVar3 = std::operator<<((ostream *)local_1b0,
                             "Unable to retrieve a valid control matrix at time: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_20);
    std::operator<<(poVar3,".");
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    iDynTree::reportError("LinearSystem","dynamicsControlFirstDerivative",pcVar4);
    std::__cxx11::string::~string(local_1e0);
    local_1 = 0;
    std::__cxx11::ostringstream::~ostringstream(local_1b0);
  }
  else {
    sVar5 = iDynTree::MatrixDynSize::rows();
    sVar6 = DynamicalSystem::stateSpaceSize(in_RDI);
    if (sVar5 == sVar6) {
      sVar5 = iDynTree::MatrixDynSize::cols();
      sVar6 = DynamicalSystem::controlSpaceSize(in_RDI);
      if (sVar5 == sVar6) {
        iDynTree::MatrixDynSize::operator=(local_28,local_38);
        local_1 = 1;
        goto LAB_002eab25;
      }
    }
    std::__cxx11::ostringstream::ostringstream(local_358);
    poVar3 = std::operator<<((ostream *)local_358,"The control matrix at time: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_20);
    std::operator<<(poVar3,
                    " has dimensions not matching with the specified state/control space dimension."
                   );
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    iDynTree::reportError("LinearSystem","dynamicsControlFirstDerivative",pcVar4);
    std::__cxx11::string::~string(local_378);
    local_1 = 0;
    std::__cxx11::ostringstream::~ostringstream(local_358);
  }
LAB_002eab25:
  return (bool)(local_1 & 1);
}

Assistant:

bool LinearSystem::dynamicsControlFirstDerivative(const VectorDynSize& /*state*/,
                                                    double time,
                                                    MatrixDynSize& dynamicsDerivative)
        {
            bool isValid = false;
            const MatrixDynSize& controlMatrix = m_pimpl->controlMatrix->get(time, isValid);

            if (!isValid) {
                std::ostringstream errorMsg;
                errorMsg << "Unable to retrieve a valid control matrix at time: " << time << ".";
                reportError("LinearSystem", "dynamicsControlFirstDerivative", errorMsg.str().c_str());
                return false;
            }

            if ((controlMatrix.rows() != stateSpaceSize()) || (controlMatrix.cols() != controlSpaceSize())) {
                std::ostringstream errorMsg;
                errorMsg << "The control matrix at time: " << time << " has dimensions not matching with the specified state/control space dimension.";
                reportError("LinearSystem", "dynamicsControlFirstDerivative", errorMsg.str().c_str());
                return false;
            }

            dynamicsDerivative = controlMatrix;
            return true;
        }